

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::SSLClient::initialize_ssl(SSLClient *this,Socket *socket)

{
  SSL *pSVar1;
  anon_class_8_1_8991fb9c unaff_RBX;
  anon_class_16_2_5362ef6e SSL_connect_or_accept;
  
  SSL_connect_or_accept.socket = (Socket *)this;
  SSL_connect_or_accept.this = (SSLClient *)socket;
  pSVar1 = detail::
           ssl_new<httplib::SSLClient::initialize_ssl(httplib::ClientImpl::Socket&)::_lambda(ssl_st*)_1_,httplib::SSLClient::initialize_ssl(httplib::ClientImpl::Socket&)::_lambda(ssl_st*)_2_>
                     ((detail *)(ulong)(uint)socket->sock,(socket_t)this->ctx_,
                      (SSL_CTX *)&this->ctx_mutex_,(mutex *)this,SSL_connect_or_accept,unaff_RBX);
  if (pSVar1 == (SSL *)0x0) {
    (*(this->super_ClientImpl)._vptr_ClientImpl[4])(this,socket,0);
  }
  else {
    socket->ssl = pSVar1;
  }
  return pSVar1 != (SSL *)0x0;
}

Assistant:

inline bool SSLClient::initialize_ssl(Socket &socket) {
  auto ssl = detail::ssl_new(
      socket.sock, ctx_, ctx_mutex_,
      [&](SSL *ssl) {
        if (server_certificate_verification_) {
          if (!load_certs()) {
            error_ = Error::SSLLoadingCerts;
            return false;
          }
          SSL_set_verify(ssl, SSL_VERIFY_NONE, nullptr);
        }

        if (!detail::ssl_connect_or_accept_nonblocking(
                socket.sock, ssl, SSL_connect, connection_timeout_sec_,
                connection_timeout_usec_)) {
          error_ = Error::SSLConnection;
          return false;
        }

        if (server_certificate_verification_) {
          verify_result_ = SSL_get_verify_result(ssl);

          if (verify_result_ != X509_V_OK) {
            error_ = Error::SSLServerVerification;
            return false;
          }

          auto server_cert = SSL_get_peer_certificate(ssl);

          if (server_cert == nullptr) {
            error_ = Error::SSLServerVerification;
            return false;
          }

          if (!verify_host(server_cert)) {
            X509_free(server_cert);
            error_ = Error::SSLServerVerification;
            return false;
          }
          X509_free(server_cert);
        }

        return true;
      },
      [&](SSL *ssl) {
        SSL_set_tlsext_host_name(ssl, host_.c_str());
        return true;
      });

  if (ssl) {
    socket.ssl = ssl;
    return true;
  }

  close_socket(socket, false);
  return false;
}